

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool packing_has_flexible_offset(BufferPackingStandard packing)

{
  bool local_9;
  BufferPackingStandard packing_local;
  
  if (((packing < BufferPackingStd140EnhancedLayout) || (packing == BufferPackingHLSLCbuffer)) ||
     (packing == BufferPackingScalar)) {
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

static bool packing_has_flexible_offset(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingStd140:
	case BufferPackingStd430:
	case BufferPackingScalar:
	case BufferPackingHLSLCbuffer:
		return false;

	default:
		return true;
	}
}